

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Reference> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  bool triple_deliminated;
  Reference v;
  bool local_181;
  Reference local_180;
  
  bVar5 = MaybeNone(this);
  if (bVar5) {
    if (value->has_value_ == true) {
      nonstd::optional_lite::detail::storage_t<tinyusdz::Reference>::destruct_value
                ((storage_t<tinyusdz::Reference> *)&value->contained);
    }
    value->has_value_ = false;
    bVar5 = true;
  }
  else {
    local_180.asset_path.asset_path_._M_dataplus._M_p =
         (pointer)&local_180.asset_path.asset_path_.field_2;
    local_180.asset_path.asset_path_._M_string_length = 0;
    local_180.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
    local_180.asset_path.resolved_path_._M_dataplus._M_p =
         (pointer)&local_180.asset_path.resolved_path_.field_2;
    local_180.asset_path.resolved_path_._M_string_length = 0;
    local_180.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
    local_180.prim_path._prim_part._M_dataplus._M_p =
         (pointer)&local_180.prim_path._prim_part.field_2;
    local_180.prim_path._prim_part._M_string_length = 0;
    local_180.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
    local_180.prim_path._prop_part._M_dataplus._M_p =
         (pointer)&local_180.prim_path._prop_part.field_2;
    local_180.prim_path._prop_part._M_string_length = 0;
    local_180.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_180.prim_path._variant_part.field_2;
    local_180.prim_path._variant_part._M_string_length = 0;
    local_180.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_180.prim_path._variant_selection_part.field_2;
    local_180.prim_path._variant_selection_part._M_string_length = 0;
    local_180.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
    paVar3 = &local_180.prim_path._variant_part_str.field_2;
    local_180.prim_path._variant_part_str._M_string_length = 0;
    local_180.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
    paVar4 = &local_180.prim_path._element.field_2;
    local_180.prim_path._element._M_string_length = 0;
    local_180.prim_path._element.field_2._M_local_buf[0] = '\0';
    local_180.prim_path._path_type.has_value_ = false;
    local_180.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_180.prim_path._valid = false;
    local_180.layerOffset._offset = 0.0;
    local_180.layerOffset._scale = 1.0;
    local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header;
    local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_180.customData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_180.prim_path._variant_part._M_dataplus._M_p = (pointer)paVar1;
    local_180.prim_path._variant_selection_part._M_dataplus._M_p = (pointer)paVar2;
    local_180.prim_path._variant_part_str._M_dataplus._M_p = (pointer)paVar3;
    local_180.prim_path._element._M_dataplus._M_p = (pointer)paVar4;
    local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar5 = ParseReference(this,&local_180,&local_181);
    if (bVar5) {
      nonstd::optional_lite::optional<tinyusdz::Reference>::operator=(value,&local_180);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase(&local_180.customData._M_t,
               (_Link_type)
               local_180.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.prim_path._element._M_dataplus._M_p != paVar4) {
      operator_delete(local_180.prim_path._element._M_dataplus._M_p,
                      CONCAT71(local_180.prim_path._element.field_2._M_allocated_capacity._1_7_,
                               local_180.prim_path._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.prim_path._variant_part_str._M_dataplus._M_p != paVar3) {
      operator_delete(local_180.prim_path._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_180.prim_path._variant_part_str.field_2._M_allocated_capacity.
                               _1_7_,local_180.prim_path._variant_part_str.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.prim_path._variant_selection_part._M_dataplus._M_p != paVar2) {
      operator_delete(local_180.prim_path._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_180.prim_path._variant_selection_part.field_2.
                               _M_allocated_capacity._1_7_,
                               local_180.prim_path._variant_selection_part.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.prim_path._variant_part._M_dataplus._M_p != paVar1) {
      operator_delete(local_180.prim_path._variant_part._M_dataplus._M_p,
                      CONCAT71(local_180.prim_path._variant_part.field_2._M_allocated_capacity._1_7_
                               ,local_180.prim_path._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.prim_path._prop_part._M_dataplus._M_p !=
        &local_180.prim_path._prop_part.field_2) {
      operator_delete(local_180.prim_path._prop_part._M_dataplus._M_p,
                      CONCAT71(local_180.prim_path._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_180.prim_path._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.prim_path._prim_part._M_dataplus._M_p !=
        &local_180.prim_path._prim_part.field_2) {
      operator_delete(local_180.prim_path._prim_part._M_dataplus._M_p,
                      CONCAT71(local_180.prim_path._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_180.prim_path._prim_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.asset_path.resolved_path_._M_dataplus._M_p !=
        &local_180.asset_path.resolved_path_.field_2) {
      operator_delete(local_180.asset_path.resolved_path_._M_dataplus._M_p,
                      CONCAT71(local_180.asset_path.resolved_path_.field_2._M_allocated_capacity.
                               _1_7_,local_180.asset_path.resolved_path_.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.asset_path.asset_path_._M_dataplus._M_p !=
        &local_180.asset_path.asset_path_.field_2) {
      operator_delete(local_180.asset_path.asset_path_._M_dataplus._M_p,
                      CONCAT71(local_180.asset_path.asset_path_.field_2._M_allocated_capacity._1_7_,
                               local_180.asset_path.asset_path_.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar5;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<Reference> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  Reference v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}